

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O2

REF_STATUS ref_shard_extract_tet(REF_GRID ref_grid,REF_CELL *ref_cell_ptr)

{
  REF_CELL ref_cell;
  uint uVar1;
  REF_STATUS RVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  int iVar6;
  REF_INT nodes [27];
  REF_INT aRStack_a8 [30];
  
  uVar1 = ref_cell_deep_copy(ref_cell_ptr,ref_grid->cell[8]);
  if (uVar1 == 0) {
    ref_cell = *ref_cell_ptr;
    for (iVar6 = 0; iVar6 < ref_grid->cell[9]->max; iVar6 = iVar6 + 1) {
      RVar2 = ref_cell_nodes(ref_grid->cell[9],iVar6,aRStack_a8);
      if ((RVar2 == 0) &&
         (uVar1 = ref_shard_add_pyr_as_tet(ref_grid->node,ref_cell,aRStack_a8,0), uVar1 != 0)) {
        pcVar5 = "converts pyr to tets";
        uVar4 = 0x48c;
        goto LAB_001bfc2d;
      }
    }
    for (iVar6 = 0; iVar6 < ref_grid->cell[10]->max; iVar6 = iVar6 + 1) {
      RVar2 = ref_cell_nodes(ref_grid->cell[10],iVar6,aRStack_a8);
      if ((RVar2 == 0) &&
         (uVar1 = ref_shard_add_pri_as_tet(ref_grid->node,ref_cell,aRStack_a8,0), uVar1 != 0)) {
        pcVar5 = "converts pri to tets";
        uVar4 = 0x492;
        goto LAB_001bfc2d;
      }
    }
    uVar1 = 0;
    for (iVar6 = 0; iVar6 < ref_grid->cell[0xb]->max; iVar6 = iVar6 + 1) {
      RVar2 = ref_cell_nodes(ref_grid->cell[0xb],iVar6,aRStack_a8);
      if ((RVar2 == 0) &&
         (uVar3 = ref_shard_add_hex_as_tet(ref_grid->node,ref_cell,aRStack_a8), uVar3 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x497,"ref_shard_extract_tet",(ulong)uVar3,"converts hex to tets");
        return uVar3;
      }
    }
  }
  else {
    pcVar5 = "deep tri copy";
    uVar4 = 0x485;
LAB_001bfc2d:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar4,
           "ref_shard_extract_tet",(ulong)uVar1,pcVar5);
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_shard_extract_tet(REF_GRID ref_grid,
                                         REF_CELL *ref_cell_ptr) {
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_CELL ref_cell;
  REF_BOOL check_volume = REF_FALSE;
  REF_BOOL check_faces = REF_FALSE;

  if (check_faces)
    RSS(ref_shard_verify_faces(ref_grid, ref_grid_tet(ref_grid)), "orig tet");

  RSS(ref_cell_deep_copy(ref_cell_ptr, ref_grid_tet(ref_grid)),
      "deep tri copy");
  ref_cell = *ref_cell_ptr;
  if (check_faces)
    RSS(ref_shard_verify_faces(ref_grid, ref_cell), "deep copy tet");
  each_ref_cell_valid_cell_with_nodes(ref_grid_pyr(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pyr_as_tet(ref_grid_node(ref_grid), ref_cell, nodes,
                                 check_volume),
        "converts pyr to tets");
  }
  if (check_faces) RSS(ref_shard_verify_faces(ref_grid, ref_cell), "add pyr");
  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pri_as_tet(ref_grid_node(ref_grid), ref_cell, nodes,
                                 check_volume),
        "converts pri to tets");
  }
  if (check_faces) RSS(ref_shard_verify_faces(ref_grid, ref_cell), "add pri");
  each_ref_cell_valid_cell_with_nodes(ref_grid_hex(ref_grid), cell, nodes) {
    RSS(ref_shard_add_hex_as_tet(ref_grid_node(ref_grid), ref_cell, nodes),
        "converts hex to tets");
  }
  if (check_faces) RSS(ref_shard_verify_faces(ref_grid, ref_cell), "add hex");

  return REF_SUCCESS;
}